

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::TextureLevel::TextureLevel
          (TextureLevel *this,TextureFormat *format,int width,int height,int depth)

{
  TextureFormat format_00;
  int iVar1;
  
  format_00 = *format;
  this->m_format = format_00;
  (this->m_data).m_ptr = (void *)0x0;
  (this->m_data).m_cap = 0;
  iVar1 = getPixelSize(format_00);
  (this->m_size).m_data[0] = width;
  (this->m_size).m_data[1] = height;
  (this->m_size).m_data[2] = depth;
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (&this->m_data,(long)(height * width * depth * iVar1));
  return;
}

Assistant:

TextureLevel::TextureLevel (const TextureFormat& format, int width, int height, int depth)
	: m_format	(format)
	, m_size	(0)
{
	setSize(width, height, depth);
}